

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

bool doctest::anon_unknown_14::parseOptionImpl(int argc,char **argv,char *pattern,String *value)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  char *__s;
  String *pSVar4;
  size_t sVar5;
  long in_RCX;
  char *in_RDX;
  long in_RSI;
  int in_EDI;
  uint len;
  char *curr;
  bool noBadCharsFound;
  char *temp;
  int index;
  int i;
  String *in_stack_ffffffffffffff88;
  String *in_stack_ffffffffffffff90;
  char *local_40;
  int local_24;
  
  local_24 = in_EDI;
  do {
    if (local_24 < 1) {
      return false;
    }
    iVar3 = local_24 + -1;
    __s = strstr(*(char **)(in_RSI + (long)iVar3 * 8),in_RDX);
    if (__s != (char *)0x0) {
      if (in_RCX == 0) {
        in_stack_ffffffffffffff88 = (String *)strlen(__s);
        pSVar4 = (String *)strlen(in_RDX);
        if (in_stack_ffffffffffffff88 != pSVar4) goto LAB_00145698;
      }
      bVar2 = true;
      local_40 = *(char **)(in_RSI + (long)iVar3 * 8);
      do {
        if (local_40 == __s) goto LAB_001455df;
        cVar1 = *local_40;
        local_40 = local_40 + 1;
      } while (cVar1 == '-');
      bVar2 = false;
LAB_001455df:
      if ((bVar2) && (**(char **)(in_RSI + (long)iVar3 * 8) == '-')) {
        if (in_RCX == 0) {
          return true;
        }
        sVar5 = strlen(in_RDX);
        sVar5 = strlen(__s + sVar5);
        if ((int)sVar5 != 0) {
          String::String(in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88);
          String::operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
          String::~String(in_stack_ffffffffffffff90);
          return true;
        }
      }
    }
LAB_00145698:
    local_24 = local_24 + -1;
  } while( true );
}

Assistant:

bool parseOptionImpl(int argc, const char* const* argv, const char* pattern, String* value) {
        // going from the end to the beginning and stopping on the first occurrence from the end
        for(int i = argc; i > 0; --i) {
            auto index = i - 1;
            auto temp = std::strstr(argv[index], pattern);
            if(temp && (value || strlen(temp) == strlen(pattern))) { //!OCLINT prefer early exits and continue
                // eliminate matches in which the chars before the option are not '-'
                bool noBadCharsFound = true;
                auto curr            = argv[index];
                while(curr != temp) {
                    if(*curr++ != '-') {
                        noBadCharsFound = false;
                        break;
                    }
                }
                if(noBadCharsFound && argv[index][0] == '-') {
                    if(value) {
                        // parsing the value of an option
                        temp += strlen(pattern);
                        const unsigned len = strlen(temp);
                        if(len) {
                            *value = temp;
                            return true;
                        }
                    } else {
                        // just a flag - no value
                        return true;
                    }
                }
            }
        }
        return false;
    }